

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall
soplex::
SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SVSetBase(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int pmax,int pmemmax,double pfac,double pmemFac)

{
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_XMM1_Qa;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar1;
  DLPSV *pfirst;
  int in_stack_ffffffffffffffc0;
  int iVar2;
  double in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  iVar2 = in_EDX;
  if (in_EDX < 1) {
    in_stack_ffffffffffffffc0 = in_ESI;
    if (in_ESI < 1) {
      in_stack_ffffffffffffffc0 = 8;
    }
    iVar2 = in_stack_ffffffffffffffc0 << 3;
  }
  ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::ClassArray(in_XMM1_Qa,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__SVSetBase_0089f778;
  pfirst = (DLPSV *)(in_RDI + 4);
  iVar1 = in_ESI;
  if (in_ESI < 1) {
    iVar1 = 8;
  }
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  ::ClassSet((ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_XMM0_Qa >> 0x20));
  IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  ::IdList((IdList<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),pfirst,
           (DLPSV *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),(bool)in_stack_ffffffffffffffaf);
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  in_RDI[0xc] = in_XMM0_Qa;
  return;
}

Assistant:

explicit
   SVSetBase(int pmax = -1, int pmemmax = -1, double pfac = 1.1, double pmemFac = 1.2)
      : SVSetBaseArray(0, (pmemmax > 0) ? pmemmax : 8 * ((pmax > 0) ? pmax : 8), pmemFac)
      , set((pmax > 0) ? pmax : 8)
      , unusedMem(0)
      , numUnusedMemUpdates(0)
      , factor(pfac)
   {
      assert(isConsistent());
   }